

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::LogMessageBody::Serialize(LogMessageBody *this,Message *msg)

{
  bool bVar1;
  void *data;
  size_t size;
  Message *msg_local;
  LogMessageBody *this_local;
  
  bVar1 = std::bitset<3UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,1,this->iid_);
  }
  bVar1 = std::bitset<3UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendString(msg,2,&this->body_);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void LogMessageBody::Serialize(::protozero::Message* msg) const {
  // Field 1: iid
  if (_has_field_[1]) {
    msg->AppendVarInt(1, iid_);
  }

  // Field 2: body
  if (_has_field_[2]) {
    msg->AppendString(2, body_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}